

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Writer.cpp
# Opt level: O3

void __thiscall
adios2::core::engine::BP5Writer::WriteData_EveryoneWrites
          (BP5Writer *this,BufferV *Data,bool SerializedWriters)

{
  uint64_t *buf;
  int iVar1;
  int iVar2;
  long lVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  undefined7 in_register_00000011;
  Comm *this_00;
  vector<adios2::core::iovec,_std::allocator<adios2::core::iovec>_> DataVec;
  uint64_t nextWriterPos_1;
  string local_a0;
  undefined4 local_7c;
  Comm local_78;
  Comm local_70;
  Comm local_68;
  iovec *local_60;
  size_t local_58;
  Status local_48;
  
  lVar3 = __dynamic_cast(this->m_Aggregator,&aggregator::MPIAggregator::typeinfo,
                         &aggregator::MPIChain::typeinfo,0);
  this_00 = (Comm *)(lVar3 + 0x20);
  iVar1 = helper::Comm::Rank(this_00);
  if (0 < iVar1) {
    iVar1 = helper::Comm::Rank(this_00);
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_a0,"Chain token in BP5Writer::WriteData","");
    helper::Comm::Recv<unsigned_long>
              ((Status *)&local_60,this_00,&this->m_DataPos,1,iVar1 + -1,0,&local_a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p);
    }
  }
  buf = &this->m_DataPos;
  uVar4 = helper::PaddingToAlignOffset
                    (this->m_DataPos,(ulong)(this->super_BP5Engine).m_Parameters.StripeSize);
  uVar4 = uVar4 + this->m_DataPos;
  this->m_DataPos = uVar4;
  this->m_StartDataPos = uVar4;
  if (!SerializedWriters) {
    iVar1 = helper::Comm::Rank(this_00);
    iVar2 = helper::Comm::Size(this_00);
    if (iVar1 < iVar2 + -1) {
      local_7c = (undefined4)CONCAT71(in_register_00000011,SerializedWriters);
      uVar4 = *buf;
      uVar5 = adios2::format::BufferV::Size(Data);
      local_60 = (iovec *)(uVar5 + uVar4);
      iVar1 = helper::Comm::Rank(this_00);
      local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_a0,"Chain token in BP5Writer::WriteData","");
      helper::Comm::Isend<unsigned_long>
                (&local_68,(unsigned_long *)this_00,(size_t)&local_60,1,iVar1 + 1,(string *)0x0);
      helper::Comm::Req::~Req((Req *)&local_68);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p);
      }
      SerializedWriters = SUB41(local_7c,0);
    }
  }
  uVar4 = adios2::format::BufferV::Size(Data);
  this->m_DataPos = this->m_DataPos + uVar4;
  (*Data->_vptr_BufferV[2])(&local_60,Data);
  transportman::TransportMan::WriteFileAt
            (&this->m_FileDataManager,local_60,(long)(local_58 - (long)local_60) >> 4,
             this->m_StartDataPos,-1);
  if (SerializedWriters != false) {
    iVar1 = helper::Comm::Rank(this_00);
    iVar2 = helper::Comm::Size(this_00);
    if (iVar1 < iVar2 + -1) {
      local_48._0_8_ = *buf;
      iVar1 = helper::Comm::Rank(this_00);
      local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_a0,"Chain token in BP5Writer::WriteData","");
      helper::Comm::Isend<unsigned_long>
                (&local_70,(unsigned_long *)this_00,(size_t)&local_48,1,iVar1 + 1,(string *)0x0);
      helper::Comm::Req::~Req((Req *)&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p);
      }
    }
  }
  iVar1 = helper::Comm::Size(this_00);
  if (1 < iVar1) {
    iVar1 = helper::Comm::Rank(this_00);
    iVar2 = helper::Comm::Size(this_00);
    if (iVar1 == iVar2 + -1) {
      local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_a0,"Final chain token in BP5Writer::WriteData","");
      helper::Comm::Isend<unsigned_long>
                (&local_78,(unsigned_long *)this_00,(size_t)buf,1,0,(string *)0x0);
      helper::Comm::Req::~Req((Req *)&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p);
      }
    }
    iVar1 = helper::Comm::Rank(this_00);
    if (iVar1 == 0) {
      iVar1 = helper::Comm::Size(this_00);
      local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_a0,"Chain token in BP5Writer::WriteData","");
      helper::Comm::Recv<unsigned_long>(&local_48,this_00,buf,1,iVar1 + -1,0,&local_a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p);
      }
    }
  }
  if (local_60 != (iovec *)0x0) {
    operator_delete(local_60);
  }
  return;
}

Assistant:

void BP5Writer::WriteData_EveryoneWrites(format::BufferV *Data, bool SerializedWriters)
{
    const aggregator::MPIChain *a = dynamic_cast<aggregator::MPIChain *>(m_Aggregator);

    // new step writing starts at offset m_DataPos on aggregator
    // others will wait for the position to arrive from the rank below

    if (a->m_Comm.Rank() > 0)
    {
        a->m_Comm.Recv(&m_DataPos, 1, a->m_Comm.Rank() - 1, 0,
                       "Chain token in BP5Writer::WriteData");
    }

    // align to PAGE_SIZE
    m_DataPos += helper::PaddingToAlignOffset(m_DataPos, m_Parameters.StripeSize);
    m_StartDataPos = m_DataPos;

    if (!SerializedWriters && a->m_Comm.Rank() < a->m_Comm.Size() - 1)
    {
        /* Send the token before writing so everyone can start writing asap */
        uint64_t nextWriterPos = m_DataPos + Data->Size();
        a->m_Comm.Isend(&nextWriterPos, 1, a->m_Comm.Rank() + 1, 0,
                        "Chain token in BP5Writer::WriteData");
    }

    m_DataPos += Data->Size();
    std::vector<core::iovec> DataVec = Data->DataVec();
    m_FileDataManager.WriteFileAt(DataVec.data(), DataVec.size(), m_StartDataPos);

    if (SerializedWriters && a->m_Comm.Rank() < a->m_Comm.Size() - 1)
    {
        /* send token now, effectively serializing the writers in the chain */
        uint64_t nextWriterPos = m_DataPos;
        a->m_Comm.Isend(&nextWriterPos, 1, a->m_Comm.Rank() + 1, 0,
                        "Chain token in BP5Writer::WriteData");
    }

    if (a->m_Comm.Size() > 1)
    {
        // at the end, last rank sends back the final data pos to first rank
        // so it can update its data pos
        if (a->m_Comm.Rank() == a->m_Comm.Size() - 1)
        {
            a->m_Comm.Isend(&m_DataPos, 1, 0, 0, "Final chain token in BP5Writer::WriteData");
        }
        if (a->m_Comm.Rank() == 0)
        {
            a->m_Comm.Recv(&m_DataPos, 1, a->m_Comm.Size() - 1, 0,
                           "Chain token in BP5Writer::WriteData");
        }
    }
}